

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

void ex_print(ex_ex *eptr)

{
  ex_ex *peVar1;
  long lVar2;
  char *pcVar3;
  ex_ex *extmp;
  ex_ex *eptr_local;
  
  peVar1 = eptr->ex_end;
  extmp = eptr;
  do {
    if (extmp->ex_type == 0 || extmp == peVar1) {
      post("\n");
      return;
    }
    switch(extmp->ex_type) {
    case 1:
      post("%ld ",(extmp->ex_cont).v_int);
      break;
    case 2:
      post("%f ",(double)(extmp->ex_cont).v_flt);
      break;
    case 3:
      lVar2 = (extmp->ex_cont).v_int;
      if (lVar2 == 0x10001) {
        post("%c",0x3b);
      }
      else if (lVar2 == 0x20002) {
        post("%c",0x2c);
      }
      else if (lVar2 == 0x3001c) {
        post("%s","=");
      }
      else if (lVar2 == 0x40003) {
        post("%s","||");
      }
      else if (lVar2 == 0x50004) {
        post("%s","&&");
      }
      else if (lVar2 == 0x60005) {
        post("%c",0x7c);
      }
      else if (lVar2 == 0x70006) {
        post("%c",0x5e);
      }
      else if (lVar2 == 0x80007) {
        post("%c",0x26);
      }
      else if (lVar2 == 0x90008) {
        post("%s","!=");
      }
      else if (lVar2 == 0x90009) {
        post("%s","==");
      }
      else if (lVar2 == 0xa000a) {
        post("%s",">=");
      }
      else if (lVar2 == 0xa000b) {
        post("%c",0x3e);
      }
      else if (lVar2 == 0xa000c) {
        post("%s","<=");
      }
      else if (lVar2 == 0xa000d) {
        post("%c",0x3c);
      }
      else if (lVar2 == 0xb000e) {
        post("%s",">>");
      }
      else if (lVar2 == 0xb000f) {
        post("%s","<<");
      }
      else if (lVar2 == 0xc0010) {
        post("%c",0x2d);
      }
      else if (lVar2 == 0xc0011) {
        post("%c",0x2b);
      }
      else if (lVar2 == 0xd0012) {
        post("%c",0x25);
      }
      else if (lVar2 == 0xd0013) {
        post("%c",0x2f);
      }
      else if (lVar2 == 0xd0014) {
        post("%c",0x2a);
      }
      else if (lVar2 == 0xe0015) {
        post("%c",0x2d);
      }
      else if (lVar2 == 0xe0016) {
        post("%c",0x7e);
      }
      else if (lVar2 == 0xe0017) {
        post("%c",0x21);
      }
      else if (lVar2 == 0xf0018) {
        post("%c ",0x5d);
      }
      else if (lVar2 == 0xf0019) {
        post("%c",0x5b);
      }
      else if (lVar2 == 0xf001a) {
        post("%c ",0x29);
      }
      else if (lVar2 == 0xf001b) {
        post("%c",0x28);
      }
      else {
        post("expr: ex_print: bad op 0x%lx\n",(extmp->ex_cont).v_int);
      }
      break;
    case 4:
      post("%s ",(extmp->ex_cont).v_int);
      break;
    case 5:
      if ((extmp->ex_cont).v_int != 0) goto switchD_001d7c2d_caseD_15;
      post("%s ","$$");
      break;
    case 6:
      post("%s ",*(undefined8 *)(extmp->ex_cont).v_vec);
      break;
    case 7:
      pcVar3 = ex_symname((fts_symbol_t)(extmp->ex_cont).v_vec);
      post("\"%s\" ",pcVar3);
      break;
    case 8:
      post("\"$s%ld\" ",(extmp->ex_cont).v_int + 1);
      break;
    case 9:
      post("%c",0x28);
      break;
    case 10:
      post("%c",0x5b);
      break;
    case 0xb:
      post("$i%ld ",(extmp->ex_cont).v_int + 1);
      break;
    case 0xc:
      post("$f%ld ",(extmp->ex_cont).v_int + 1);
      break;
    case 0xd:
      post("$s%lx ",(extmp->ex_cont).v_int);
      break;
    case 0xe:
      post("$v%lx ",(extmp->ex_cont).v_int);
      break;
    case 0xf:
      post("vec = %ld ",(extmp->ex_cont).v_int);
      break;
    case 0x10:
    case 0x11:
      post("$y%d",(extmp->ex_cont).v_int + 1);
      break;
    case 0x12:
    case 0x14:
      post("$x%d",(extmp->ex_cont).v_int + 1);
      break;
    default:
      post("expr: ex_print: bad type 0x%lx\n",extmp->ex_type);
      break;
    case 0x15:
switchD_001d7c2d_caseD_15:
      pcVar3 = ex_symname((fts_symbol_t)(extmp->ex_cont).v_vec);
      post("%s ",pcVar3);
    }
    extmp = extmp + 1;
  } while( true );
}

Assistant:

void
ex_print(struct ex_ex *eptr)
{
                struct ex_ex *extmp;

                extmp = eptr->ex_end;
        while (eptr->ex_type && eptr != extmp) {
                switch (eptr->ex_type) {
                case ET_INT:
                        post("%ld ", eptr->ex_int);
                        break;
                case ET_FLT:
                        post("%f ", eptr->ex_flt);
                        break;
                case ET_STR:
                        post("%s ", eptr->ex_ptr);
                        break;
                case ET_TBL:
                        if (!eptr->ex_ptr) { /* special case of $# processing */
                                post("%s ", "$$");
                            break;
                        }
                            /* falls through */
                case ET_VAR:
                        post("%s ", ex_symname((fts_symbol_t )eptr->ex_ptr));
                        break;
                case ET_SYM:
                        post("\"%s\" ", ex_symname((fts_symbol_t )eptr->ex_ptr));
                        break;
                case ET_VSYM:
                        post("\"$s%ld\" ", eptr->ex_int + 1);
                        break;
                case ET_FUNC:
                        post("%s ",
                            ((t_ex_func *)eptr->ex_ptr)->f_name);
                        break;
                case ET_LP:
                        post("%c", '(');
                        break;
                        /* CHANGE
                 case ET_RP:
                         post("%c ", ')');
                         break;
                         */
                case ET_LB:
                        post("%c", '[');
                        break;
                        /* CHANGE
                case ET_RB:
                         post("%c ", ']');
                         break;
                         */
                case ET_II:
                        post("$i%ld ", eptr->ex_int + 1);
                        break;
                case ET_FI:
                        post("$f%ld ", eptr->ex_int + 1);
                        break;
                case ET_SI:
                        post("$s%lx ", eptr->ex_ptr);
                        break;
                case ET_VI:
                        post("$v%lx ", eptr->ex_vec);
                        break;
                case ET_VEC:
                        post("vec = %ld ", eptr->ex_vec);
                        break;
                case ET_YOM1:
                case ET_YO:
                        post("$y%d", eptr->ex_int + 1);
                        break;
                case ET_XI:
                case ET_XI0:
                        post("$x%d", eptr->ex_int + 1);
                        break;
                case ET_OP:
                        switch (eptr->ex_op) {
                        case OP_LP:
                                post("%c", '(');
                                break;
                        case OP_RP:
                                post("%c ", ')');
                                break;
                        case OP_LB:
                                post("%c", '[');
                                break;
                        case OP_RB:
                                post("%c ", ']');
                                break;
                        case OP_NOT:
                                post("%c", '!');
                                break;
                        case OP_NEG:
                                post("%c", '~');
                                break;
                        case OP_UMINUS:
                                post("%c", '-');
                                break;
                        case OP_MUL:
                                post("%c", '*');
                                break;
                        case OP_DIV:
                                post("%c", '/');
                                break;
                        case OP_MOD:
                                post("%c", '%');
                                break;
                        case OP_ADD:
                                post("%c", '+');
                                break;
                        case OP_SUB:
                                post("%c", '-');
                                break;
                        case OP_SL:
                                post("%s", "<<");
                                break;
                        case OP_SR:
                                post("%s", ">>");
                                break;
                        case OP_LT:
                                post("%c", '<');
                                break;
                        case OP_LE:
                                post("%s", "<=");
                                break;
                        case OP_GT:
                                post("%c", '>');
                                break;
                        case OP_GE:
                                post("%s", ">=");
                                break;
                        case OP_EQ:
                                post("%s", "==");
                                break;
                        case OP_STORE:
                                post("%s", "=");
                                break;
                        case OP_NE:
                                post("%s", "!=");
                                break;
                        case OP_AND:
                                post("%c", '&');
                                break;
                        case OP_XOR:
                                post("%c", '^');
                                break;
                        case OP_OR:
                                post("%c", '|');
                                break;
                        case OP_LAND:
                                post("%s", "&&");
                                break;
                        case OP_LOR:
                                post("%s", "||");
                                break;
                        case OP_COMMA:
                                post("%c", ',');
                                break;
                        case OP_SEMI:
                                post("%c", ';');
                                break;
                        default:
                                post("expr: ex_print: bad op 0x%lx\n", eptr->ex_op);
                        }
                        break;
                default:
                        post("expr: ex_print: bad type 0x%lx\n", eptr->ex_type);
                }
                eptr++;
        }
        post("\n");
}